

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_field_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::PriceFieldTest_TestOStreamDouble_Test::TestBody
          (PriceFieldTest_TestOStreamDouble_Test *this)

{
  char *message;
  AssertHelper AStack_1d8;
  AssertionResult gtest_ar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  PriceField field;
  stringstream ss;
  long local_180;
  undefined8 local_178 [2];
  uint auStack_168 [88];
  
  bidfx_public_api::price::PriceField::PriceField(&field,200.47229);
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  *(uint *)((long)auStack_168 + *(long *)(local_180 + -0x18)) =
       *(uint *)((long)auStack_168 + *(long *)(local_180 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_178 + *(long *)(local_180 + -0x18)) = 6;
  bidfx_public_api::price::operator<<((ostream *)&local_180,&field);
  std::__cxx11::stringbuf::str();
  testing::internal::CmpHelperEQ<char[11],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"200.472290\"","ss.str()",(char (*) [11])"200.472290",
             &local_1c0);
  std::__cxx11::string::~string((string *)&local_1c0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_1c0);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&AStack_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/messages/price_field_test.cpp"
               ,0x5a,message);
    testing::internal::AssertHelper::operator=(&AStack_1d8,(Message *)&local_1c0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_1d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_1c0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  bidfx_public_api::price::PriceField::~PriceField(&field);
  return;
}

Assistant:

TEST(PriceFieldTest, TestOStreamDouble)
{
    double value = 200.47229;
    PriceField field = PriceField(value);
    std::stringstream ss;
    ss << std::fixed << std::setprecision(6) << field;
    EXPECT_EQ("200.472290", ss.str());
}